

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O0

void juzzlin::StreamTest::testTag_fatalLevel_shouldPrintTag
               (string *message,string *timestampSeparator)

{
  string *message_00;
  string *in_RDI;
  string tag;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  SimpleLogger local_1d8 [15];
  undefined1 local_1c9 [49];
  stringstream local_198 [16];
  ostream local_188 [384];
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  juzzlin::SimpleLogger::setStream(Fatal,local_188);
  juzzlin::SimpleLogger::setLoggingLevel(Fatal);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::allocator<char>::~allocator((allocator<char> *)local_1c9);
  juzzlin::SimpleLogger::SimpleLogger(local_1d8,(string *)(local_1c9 + 1));
  message_00 = (string *)juzzlin::SimpleLogger::fatal_abi_cxx11_();
  std::operator<<((ostream *)message_00,local_8);
  juzzlin::SimpleLogger::~SimpleLogger(local_1d8);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::operator+(in_stack_fffffffffffffde8,__rhs);
  assertMessage((stringstream *)__rhs,message_00,(string *)0x10692e);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
  std::__cxx11::string::~string((string *)(local_1c9 + 1));
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void testTag_fatalLevel_shouldPrintTag(const std::string & message, const std::string & timestampSeparator)
{
    std::stringstream ss;
    L::setStream(L::Level::Fatal, ss);
    L::setLoggingLevel(L::Level::Fatal);
    const std::string tag = "TAG";
    L(tag).fatal() << message;
    assertMessage(ss, tag + ": " + message, timestampSeparator);
}